

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::doubletonEq
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt row,RowType rowType)

{
  double *pdVar1;
  double dVar2;
  double substLower;
  double substUpper;
  bool bVar3;
  int iVar4;
  HighsLp *pHVar5;
  pointer pHVar6;
  pointer pdVar7;
  pointer piVar8;
  pointer pdVar9;
  bool bVar10;
  bool bVar11;
  double dVar12;
  Result RVar13;
  long lVar14;
  long lVar15;
  pointer piVar16;
  long lVar17;
  int iVar18;
  int col;
  bool bVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double newLower;
  double newUpper;
  HighsMatrixSlice<HighsTripletListSlice> local_50;
  
  bVar3 = (this->analysis_).logging_on_;
  if (bVar3 == true) {
    HPresolveAnalysis::startPresolveRuleLog(&this->analysis_,9);
  }
  lVar14 = (long)(this->rowroot).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[row];
  piVar16 = (this->ARright).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (piVar16[lVar14] == -1) {
    piVar16 = (this->ARleft).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  lVar17 = (long)piVar16[lVar14];
  pHVar5 = this->model;
  piVar16 = (this->Acol).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  col = piVar16[lVar14];
  pHVar6 = (pHVar5->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>.
           _M_impl.super__Vector_impl_data._M_start;
  iVar18 = piVar16[lVar17];
  if (pHVar6[col] == kInteger) {
    if (pHVar6[iVar18] == kInteger) {
      pdVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      dVar20 = ABS(pdVar7[lVar14]);
      dVar22 = ABS(pdVar7[lVar17]);
      dVar2 = (this->options->super_HighsOptionsStruct).small_matrix_value;
      if (dVar20 < dVar22 - dVar2) goto LAB_0031488e;
      if (dVar20 - dVar2 <= dVar22) {
        piVar8 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar4 = piVar8[col];
        iVar18 = piVar8[iVar18];
        bVar19 = SBORROW4(iVar4,iVar18);
        iVar4 = iVar4 - iVar18;
LAB_00314817:
        bVar19 = bVar19 != iVar4 < 0;
LAB_00314889:
        if (bVar19) goto LAB_0031488e;
      }
    }
LAB_0031489d:
    iVar18 = piVar16[lVar17];
    lVar15 = lVar14;
  }
  else {
    if (pHVar6[iVar18] != kInteger) {
      piVar8 = (this->colsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar4 = piVar8[col];
      if (iVar4 != 1) {
        iVar18 = piVar8[iVar18];
        if (iVar18 != 1) {
          pdVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          dVar22 = ABS(pdVar7[lVar14]);
          dVar2 = ABS(pdVar7[lVar17]);
          if (iVar4 != iVar18) {
            dVar20 = dVar2;
            if (dVar2 <= dVar22) {
              dVar20 = dVar22;
            }
            dVar21 = dVar2;
            if (dVar22 <= dVar2) {
              dVar21 = dVar22;
            }
            if (dVar20 <= dVar21 + dVar21) {
              bVar19 = SBORROW4(iVar4,iVar18);
              iVar4 = iVar4 - iVar18;
              goto LAB_00314817;
            }
          }
          bVar19 = dVar2 < dVar22;
          goto LAB_00314889;
        }
        goto LAB_0031489d;
      }
    }
LAB_0031488e:
    piVar16 = piVar16 + lVar17;
    lVar15 = lVar17;
    lVar17 = lVar14;
    iVar18 = col;
    col = *piVar16;
  }
  pdVar7 = (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar2 = pdVar7[lVar17];
  dVar22 = pdVar7[lVar15];
  dVar20 = (pHVar5->row_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[row];
  dVar23 = dVar20;
  dVar21 = dVar22;
  if ((pHVar6[iVar18] == kInteger) && (pHVar6[col] == kInteger)) {
    dVar21 = round(dVar22 / dVar2);
    dVar21 = dVar21 * dVar2;
    bVar19 = false;
    pdVar1 = &(this->options->super_HighsOptionsStruct).small_matrix_value;
    if (ABS(dVar21 - dVar22) < *pdVar1 || ABS(dVar21 - dVar22) == *pdVar1) {
      dVar23 = round(dVar20 / dVar2);
      dVar22 = ABS(dVar20 - dVar23 * dVar2);
      bVar10 = dVar22 == this->primal_feastol;
      bVar11 = dVar22 < this->primal_feastol;
      bVar19 = bVar11 || bVar10;
      dVar23 = dVar23 * dVar2;
      if (!bVar11 && !bVar10) {
        dVar23 = dVar20;
      }
      RVar13 = kPrimalInfeasible;
    }
    else {
      RVar13 = kOk;
      dVar21 = dVar22;
    }
    if (!bVar19) {
      return RVar13;
    }
  }
  pdVar7 = (pHVar5->col_lower_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = (pHVar5->col_upper_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar22 = pdVar7[col];
  dVar20 = pdVar9[col];
  substLower = pdVar7[iVar18];
  substUpper = pdVar9[iVar18];
  if ((long)((ulong)dVar21 ^ (ulong)dVar2) < 0) {
    newLower = -INFINITY;
    if (-INFINITY < substLower) {
      local_50.nodeIndex = (HighsInt *)(dVar23 - dVar2 * substLower);
      local_50.nodeValue =
           (double *)
           ((-(dVar2 * substLower) - ((double)local_50.nodeIndex - dVar23)) +
            (dVar23 - ((double)local_50.nodeIndex - ((double)local_50.nodeIndex - dVar23))) + 0.0);
      HighsCDouble::operator/=((HighsCDouble *)&local_50,dVar21);
      newLower = (double)local_50.nodeIndex + (double)local_50.nodeValue;
    }
    newUpper = INFINITY;
    dVar12 = substUpper;
    if (INFINITY <= substUpper) goto LAB_00314b74;
  }
  else {
    newLower = -INFINITY;
    if (substUpper < INFINITY) {
      local_50.nodeIndex = (HighsInt *)(dVar23 - dVar2 * substUpper);
      local_50.nodeValue =
           (double *)
           ((-(dVar2 * substUpper) - ((double)local_50.nodeIndex - dVar23)) +
            (dVar23 - ((double)local_50.nodeIndex - ((double)local_50.nodeIndex - dVar23))) + 0.0);
      HighsCDouble::operator/=((HighsCDouble *)&local_50,dVar21);
      newLower = (double)local_50.nodeIndex + (double)local_50.nodeValue;
    }
    dVar12 = substLower;
    if (substLower <= -INFINITY) {
      newUpper = INFINITY;
      goto LAB_00314b74;
    }
  }
  local_50.nodeIndex = (HighsInt *)(dVar23 - dVar2 * dVar12);
  local_50.nodeValue =
       (double *)
       ((-(dVar2 * dVar12) - ((double)local_50.nodeIndex - dVar23)) +
        (dVar23 - ((double)local_50.nodeIndex - ((double)local_50.nodeIndex - dVar23))) + 0.0);
  HighsCDouble::operator/=((HighsCDouble *)&local_50,dVar21);
  newUpper = (double)local_50.nodeIndex + (double)local_50.nodeValue;
LAB_00314b74:
  dVar22 = dVar22 + this->primal_feastol;
  if (dVar22 < newLower) {
    changeColLower(this,col,newLower);
  }
  dVar20 = dVar20 - this->primal_feastol;
  if (newUpper < dVar20) {
    changeColUpper(this,col,newUpper);
  }
  local_50.nodeValue =
       (this->Avalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_50.nodeIndex =
       (this->Arow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_50.nodeNext =
       (this->Anext).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_50.head =
       (this->colhead).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
       ._M_start[iVar18];
  HighsPostsolveStack::doubletonEquation<HighsTripletListSlice>
            (postsolve_stack,row,iVar18,col,dVar2,dVar21,dVar23,substLower,substUpper,
             (this->model->col_cost_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[iVar18],dVar22 < newLower,newUpper < dVar20,rowType,
             &local_50);
  (this->changedColFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[iVar18] = '\x01';
  (this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[iVar18] = '\x01';
  this->numDeletedCols = this->numDeletedCols + 1;
  removeRow(this,row);
  substitute(this,iVar18,col,dVar23 / dVar2,-dVar21 / dVar2);
  (this->analysis_).logging_on_ = bVar3;
  if (bVar3 != false) {
    HPresolveAnalysis::stopPresolveRuleLog(&this->analysis_,9);
  }
  RVar13 = removeRowSingletons(this,postsolve_stack);
  if (RVar13 == kOk) {
    RVar13 = checkLimits(this,postsolve_stack);
  }
  return RVar13;
}

Assistant:

HPresolve::Result HPresolve::doubletonEq(HighsPostsolveStack& postsolve_stack,
                                         HighsInt row,
                                         HighsPostsolveStack::RowType rowType) {
  assert(analysis_.allow_rule_[kPresolveRuleDoubletonEquation]);
  const bool logging_on = analysis_.logging_on_;
  if (logging_on)
    analysis_.startPresolveRuleLog(kPresolveRuleDoubletonEquation);
  assert(!rowDeleted[row]);
  assert(rowsize[row] == 2);
  assert(model->row_lower_[row] == model->row_upper_[row]);

  // printf("doubleton equation: ");
  // debugPrintRow(row);
  HighsInt nzPos1 = rowroot[row];
  HighsInt nzPos2 = ARright[nzPos1] != -1 ? ARright[nzPos1] : ARleft[nzPos1];

  auto colAtPos1Better = [&]() {
    if (model->integrality_[Acol[nzPos1]] == HighsVarType::kInteger) {
      if (model->integrality_[Acol[nzPos2]] == HighsVarType::kInteger) {
        // both columns integer. For substitution choose smaller absolute
        // coefficient value, or sparser column if values are equal
        if (std::fabs(Avalue[nzPos1]) <
            std::fabs(Avalue[nzPos2]) - options->small_matrix_value) {
          return true;
        } else if (std::fabs(Avalue[nzPos2]) <
                   std::fabs(Avalue[nzPos1]) - options->small_matrix_value) {
          return false;
        } else if (colsize[Acol[nzPos1]] < colsize[Acol[nzPos2]]) {
          return true;
        } else {
          return false;
        }
      } else {
        // one col is integral, substitute the continuous one
        return false;
      }
    } else {
      if (model->integrality_[Acol[nzPos2]] == HighsVarType::kInteger) {
        // one col is integral, substitute the continuous one
        return true;
      } else {
        // both columns continuous the one with a larger absolute coefficient
        // value if the difference is more than factor 2, and otherwise the one
        // with fewer nonzeros if those are equal
        HighsInt col1Size = colsize[Acol[nzPos1]];
        if (col1Size == 1)
          return true;
        else {
          HighsInt col2Size = colsize[Acol[nzPos2]];
          if (col2Size == 1)
            return false;
          else {
            double abs1Val = std::fabs(Avalue[nzPos1]);
            double abs2Val = std::fabs(Avalue[nzPos2]);
            if (col1Size != col2Size &&
                std::max(abs1Val, abs2Val) <= 2.0 * std::min(abs1Val, abs2Val))
              return (col1Size < col2Size);
            else if (abs1Val > abs2Val)
              return true;
            else
              return false;
          }
        }
      }
    }
  };

  HighsInt substcol;
  HighsInt staycol;
  double substcoef;
  double staycoef;

  if (colAtPos1Better()) {
    substcol = Acol[nzPos1];
    staycol = Acol[nzPos2];

    substcoef = Avalue[nzPos1];
    staycoef = Avalue[nzPos2];
  } else {
    substcol = Acol[nzPos2];
    staycol = Acol[nzPos1];

    substcoef = Avalue[nzPos2];
    staycoef = Avalue[nzPos1];
  }

  double rhs = model->row_upper_[row];
  if (model->integrality_[substcol] == HighsVarType::kInteger &&
      model->integrality_[staycol] == HighsVarType::kInteger) {
    // check integrality conditions
    double roundCoef = std::round(staycoef / substcoef) * substcoef;
    if (std::fabs(roundCoef - staycoef) > options->small_matrix_value)
      return Result::kOk;
    staycoef = roundCoef;
    double roundRhs = std::round(rhs / substcoef) * substcoef;
    if (std::fabs(rhs - roundRhs) > primal_feastol)
      return Result::kPrimalInfeasible;
    rhs = roundRhs;
  }

  double oldStayLower = model->col_lower_[staycol];
  double oldStayUpper = model->col_upper_[staycol];
  double substLower = model->col_lower_[substcol];
  double substUpper = model->col_upper_[substcol];

  double stayImplLower;
  double stayImplUpper;
  if (std::signbit(substcoef) != std::signbit(staycoef)) {
    // coefficients have the opposite sign, therefore the implied lower bound of
    // the stay column is computed from the lower bound of the substituted
    // column:
    // staycol * staycoef + substcol * substcoef = rhs
    // staycol = (rhs - substcol * substcoef) / staycoef
    // staycol >= rhs / staycoef + lower(-substcoef/staycoef * substcol)
    // lower(-substcoef/staycoef * substcol) is (-substcoef/staycoef) *
    // substLower if (-substcoef/staycoef) is positive, i.e. if the coefficients
    // have opposite sign
    stayImplLower = substLower == -kHighsInf
                        ? -kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substLower) /
                                              staycoef);
    stayImplUpper = substUpper == kHighsInf
                        ? kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substUpper) /
                                              staycoef);
  } else {
    stayImplLower = substUpper == kHighsInf
                        ? -kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substUpper) /
                                              staycoef);
    stayImplUpper = substLower == -kHighsInf
                        ? kHighsInf
                        : static_cast<double>((static_cast<HighsCDouble>(rhs) -
                                               substcoef * substLower) /
                                              staycoef);
  }

  // possibly tighten bounds of the column that stays
  bool lowerTightened = stayImplLower > oldStayLower + primal_feastol;
  if (lowerTightened) changeColLower(staycol, stayImplLower);

  bool upperTightened = stayImplUpper < oldStayUpper - primal_feastol;
  if (upperTightened) changeColUpper(staycol, stayImplUpper);

  postsolve_stack.doubletonEquation(
      row, substcol, staycol, substcoef, staycoef, rhs, substLower, substUpper,
      model->col_cost_[substcol], lowerTightened, upperTightened, rowType,
      getColumnVector(substcol));

  // finally modify matrix
  markColDeleted(substcol);
  removeRow(row);
  substitute(substcol, staycol, rhs / substcoef, -staycoef / substcoef);

  analysis_.logging_on_ = logging_on;
  if (logging_on) analysis_.stopPresolveRuleLog(kPresolveRuleDoubletonEquation);

  // since a column was deleted we might have new row singletons which we
  // immediately remove
  HPRESOLVE_CHECKED_CALL(removeRowSingletons(postsolve_stack));

  return checkLimits(postsolve_stack);
}